

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

void __thiscall QLayout::addChildLayout(QLayout *this,QLayout *childLayout)

{
  QWidget *mw;
  undefined8 uVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)&childLayout->field_0x8 + 0x10) == 0) {
    QObject::setParent(&childLayout->super_QObject);
    mw = parentWidget(this);
    if (mw != (QWidget *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QLayoutPrivate::reparentChildWidgets(*(QLayoutPrivate **)&childLayout->field_0x8,mw);
        return;
      }
      goto LAB_002e3d6f;
    }
  }
  else {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = "default";
    (*(code *)**(undefined8 **)childLayout)(childLayout);
    uVar1 = QMetaObject::className();
    QObject::objectName();
    uVar2 = QString::utf16();
    QMessageLogger::warning
              (local_48,"QLayout::addChildLayout: layout %s \"%ls\" already has a parent",uVar1,
               uVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_002e3d6f:
  __stack_chk_fail();
}

Assistant:

void QLayout::addChildLayout(QLayout *childLayout)
{
    if (Q_UNLIKELY(childLayout->parent())) {
        qWarning("QLayout::addChildLayout: layout %s \"%ls\" already has a parent",
                 childLayout->metaObject()->className(), qUtf16Printable(childLayout->objectName()));
        return;
    }
    childLayout->setParent(this);

    if (QWidget *mw = parentWidget()) {
        childLayout->d_func()->reparentChildWidgets(mw);
    }

}